

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int uv_fs_write(uv_loop_t *loop,uv_fs_t *req,uv_os_fd_t file,uv_buf_t *bufs,uint nbufs,int64_t off,
               uv_fs_cb cb)

{
  int iVar1;
  uv_buf_t *puVar2;
  int iVar3;
  
  iVar3 = -0x16;
  if (req != (uv_fs_t *)0x0) {
    req->loop = loop;
    req->type = UV_FS;
    req->fs_type = UV_FS_WRITE;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->path = (char *)0x0;
    req->cb = cb;
    if (nbufs != 0 && bufs != (uv_buf_t *)0x0) {
      req->file = file;
      req->nbufs = nbufs;
      req->bufs = req->bufsml;
      if (4 < nbufs) {
        puVar2 = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
        req->bufs = puVar2;
      }
      if (req->bufs == (uv_buf_t *)0x0) {
        iVar3 = -0xc;
      }
      else {
        memcpy(req->bufs,bufs,(ulong)nbufs << 4);
        req->off = off;
        if (cb == (uv_fs_cb)0x0) {
          uv__fs_work(&req->work_req);
          iVar3 = (int)req->result;
        }
        else {
          iVar1 = uv__iou_fs_read_or_write(loop,req,0);
          iVar3 = 0;
          if (iVar1 == 0) {
            (loop->active_reqs).count = (loop->active_reqs).count + 1;
            uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_write(uv_loop_t* loop,
                uv_fs_t* req,
                uv_os_fd_t file,
                const uv_buf_t bufs[],
                unsigned int nbufs,
                int64_t off,
                uv_fs_cb cb) {
  INIT(WRITE);

  if (bufs == NULL || nbufs == 0)
    return UV_EINVAL;

  req->file = file;

  req->nbufs = nbufs;
  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(*bufs));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(*bufs));

  req->off = off;

  if (cb != NULL)
    if (uv__iou_fs_read_or_write(loop, req, /* is_read */ 0))
      return 0;

  POST;
}